

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.h
# Opt level: O0

char * __thiscall
NativeCodeData::AllocatorT<Js::EHBailoutData>::AddFixup
          (AllocatorT<Js::EHBailoutData> *this,char *dataBlock)

{
  bool bVar1;
  DataChunk *pDVar2;
  char *pcVar3;
  DataChunk *chunk;
  char *dataBlock_local;
  AllocatorT<Js::EHBailoutData> *this_local;
  
  if (((this->super_Allocator).isOOPJIT & 1U) != 0) {
    pDVar2 = GetDataChunk(dataBlock);
    pDVar2->fixupFunc = Fixup;
    pcVar3 = std::type_info::name((type_info *)&Js::EHBailoutData::typeinfo);
    pDVar2->dataType = pcVar3;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
    if (bVar1) {
      Output::Print(L"NativeCodeData Alloc: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"
                    ,pDVar2,dataBlock,(ulong)pDVar2->allocIndex,(ulong)pDVar2->len,
                    (ulong)pDVar2->offset,pDVar2->dataType);
    }
  }
  return dataBlock;
}

Assistant:

char* AddFixup(char* dataBlock)
        {
            if (isOOPJIT)
            {
                DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                chunk->fixupFunc = &Fixup;
#if DBG
                chunk->dataType = typeid(T).name();
                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData Alloc: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                        chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                }
#endif
            }
            return dataBlock;
        }